

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::removeAlmostSignExt(OptimizeInstructions *this,Binary *outer)

{
  bool bVar1;
  Literal local_58;
  OptimizeInstructions *local_40;
  Expression *value;
  Const *innerConst;
  Const *outerConst;
  Binary *inner;
  Binary *outer_local;
  OptimizeInstructions *this_local;
  
  inner = outer;
  outer_local = (Binary *)this;
  outerConst = (Const *)Expression::cast<wasm::Binary>(outer->left);
  innerConst = Expression::cast<wasm::Const>(inner->right);
  value = (Expression *)Expression::cast<wasm::Const>((Expression *)(outerConst->value).type.id);
  local_40 = (OptimizeInstructions *)
             (outerConst->value).field_0.gcData.
             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  bVar1 = wasm::Literal::operator==(&innerConst->value,&((Const *)value)->value);
  if (bVar1) {
    this_local = local_40;
  }
  else {
    wasm::Literal::sub(&local_58,(Literal *)(value + 1),&innerConst->value);
    wasm::Literal::operator=((Literal *)(value + 1),&local_58);
    wasm::Literal::~Literal(&local_58);
    this_local = (OptimizeInstructions *)outerConst;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* removeAlmostSignExt(Binary* outer) {
    auto* inner = outer->left->cast<Binary>();
    auto* outerConst = outer->right->cast<Const>();
    auto* innerConst = inner->right->cast<Const>();
    auto* value = inner->left;
    if (outerConst->value == innerConst->value) {
      return value;
    }
    // add a shift, by reusing the existing node
    innerConst->value = innerConst->value.sub(outerConst->value);
    return inner;
  }